

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

int socketsys::UnixProvider::connect(int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  int extraout_EAX;
  pointer pvVar2;
  const_pointer __name;
  NameResolveException *this;
  SocketBindException *this_00;
  int *piVar3;
  addrinfo *paStack_78;
  int result;
  addrinfo *res;
  addrinfo hints;
  int local_38;
  socklen_t length;
  int type;
  socklen_t size;
  sockaddr data;
  array<char,_6UL> portBuffer;
  uint16_t port_local;
  string_view *address_local;
  SocketHandle handle_local;
  
  data.sa_data._12_2_ = SUB42(__len,0);
  memset(data.sa_data + 6,0,6);
  pvVar2 = std::array<char,_6UL>::data((array<char,_6UL> *)(data.sa_data + 6));
  sprintf(pvVar2,"%d",(ulong)(ushort)data.sa_data._12_2_);
  memset(&type,0,0x10);
  length = 0x10;
  getsockname(__fd,(sockaddr *)&type,&length);
  hints.ai_next._4_4_ = 4;
  getsockopt(__fd,1,3,&local_38,(socklen_t *)((long)&hints.ai_next + 4));
  memset(&res,0,0x30);
  res._0_4_ = 0;
  res._4_4_ = (uint)(ushort)type;
  hints.ai_flags = local_38;
  hints.ai_family = 0x11;
  if (local_38 == 1) {
    hints.ai_family = 6;
  }
  __name = std::basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)__addr);
  pvVar2 = std::array<char,_6UL>::data((array<char,_6UL> *)(data.sa_data + 6));
  iVar1 = getaddrinfo(__name,pvVar2,(addrinfo *)&res,&stack0xffffffffffffff88);
  if (iVar1 != 0) {
    this = (NameResolveException *)__cxa_allocate_exception(0x10);
    NameResolveException::NameResolveException(this,"Linux failed to resolve address ",iVar1);
    __cxa_throw(this,&NameResolveException::typeinfo,NameResolveException::~NameResolveException);
  }
  iVar1 = ::connect(__fd,paStack_78->ai_addr,paStack_78->ai_addrlen);
  freeaddrinfo(paStack_78);
  if (iVar1 == -1) {
    this_00 = (SocketBindException *)__cxa_allocate_exception(0x10);
    piVar3 = __errno_location();
    SocketBindException::SocketBindException(this_00,"Linux failed to connect socket ",*piVar3);
    __cxa_throw(this_00,&SocketBindException::typeinfo,SocketBindException::~SocketBindException);
  }
  return extraout_EAX;
}

Assistant:

void UnixProvider::connect(SocketHandle handle, const std::string_view& address, uint16_t port) {
    std::array<char, 6> portBuffer{};
    sprintf(portBuffer.data(), "%d", port);

    sockaddr data{};
    socklen_t size = sizeof(sockaddr);
    getsockname(handle, &data, &size);

    int type;
    socklen_t length = sizeof(int);
    getsockopt(handle, SOL_SOCKET, SO_TYPE, &type, &length);

    addrinfo hints {
            {},
            data.sa_family,
            type,
            type == SOCK_STREAM ? IPPROTO_TCP : IPPROTO_UDP,
    };

    addrinfo* res;
    auto result = getaddrinfo(address.data(), portBuffer.data(), &hints, &res);
    if (result != 0) {
        throw NameResolveException("Linux failed to resolve address ", result);
    }

    result = ::connect(handle, res->ai_addr, res->ai_addrlen);
    freeaddrinfo(res);

    if (result == -1) {
        throw SocketBindException("Linux failed to connect socket ", errno);
    }
}